

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,basic_format_specs<char> *specs)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __result;
  long lVar4;
  char *pcVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  buffer<char> *buf;
  bool bVar10;
  undefined8 uStack_50;
  char local_48 [24];
  
  uVar6 = value;
  uVar8 = 2;
  do {
    uVar7 = uVar8;
    uVar8 = uVar7 + 1;
    bVar10 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar10);
  if (specs == (basic_format_specs<char> *)0x0) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + uVar8) {
      uStack_50 = (code *)0x1236c2;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_50 = (code *)0x1236d7;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar4 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar4) = 0x30;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_50 = (code *)0x123700;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar4 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar4) = 0x78;
    lVar4 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar3 = lVar4 + -2 + uVar8;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar3) {
      lVar4 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar3;
      lVar4 = lVar4 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 8);
    }
    if (lVar4 == 0) {
      pcVar5 = local_48 + (uVar7 - 2);
      do {
        *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
      uStack_50 = (code *)0x123841;
      out = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                      (local_48,local_48 + (uVar7 - 1),out);
    }
    else {
      pcVar5 = (char *)(lVar4 + -3 + uVar8);
      do {
        *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
    }
  }
  else {
    uVar3 = (ulong)specs->width;
    if ((long)uVar3 < 0) {
      uStack_50 = format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  ::on_text;
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    uVar9 = 0;
    if (uVar8 <= uVar3) {
      uVar9 = uVar3 - uVar8;
    }
    cVar2 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        (specs->fill).size_ * uVar9 +
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + uVar8) {
      uStack_50 = (code *)0x123627;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar3 = uVar9 >> ((long)cVar2 & 0x3fU);
    uStack_50 = (code *)0x12363e;
    __result.container =
         (buffer<char> *)fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar3,&specs->fill);
    if (*(ulong *)((long)__result.container + 0x18) <
        *(long *)((long)__result.container + 0x10) + 1U) {
      uStack_50 = (code *)0x123656;
      (*(code *)**(undefined8 **)__result.container)(__result.container);
    }
    lVar4 = *(long *)((long)__result.container + 0x10);
    *(long *)((long)__result.container + 0x10) = lVar4 + 1;
    *(undefined1 *)(*(long *)((long)__result.container + 8) + lVar4) = 0x30;
    if (*(ulong *)((long)__result.container + 0x18) <
        *(long *)((long)__result.container + 0x10) + 1U) {
      uStack_50 = (code *)0x12367f;
      (*(code *)**(undefined8 **)__result.container)(__result.container);
    }
    lVar4 = *(long *)((long)__result.container + 0x10);
    *(long *)((long)__result.container + 0x10) = lVar4 + 1;
    *(undefined1 *)(*(long *)((long)__result.container + 8) + lVar4) = 0x78;
    lVar4 = *(long *)((long)__result.container + 0x10);
    uVar1 = lVar4 + -2 + uVar8;
    if (*(ulong *)((long)__result.container + 0x18) < uVar1) {
      lVar4 = 0;
    }
    else {
      *(ulong *)((long)__result.container + 0x10) = uVar1;
      lVar4 = lVar4 + *(long *)((long)__result.container + 8);
    }
    if (lVar4 == 0) {
      pcVar5 = local_48 + (uVar7 - 2);
      do {
        *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
      uStack_50 = (code *)0x1237a3;
      __result.container =
           (buffer<char> *)
           std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (local_48,local_48 + (uVar7 - 1),(buffer_appender<char>)__result.container);
    }
    else {
      pcVar5 = (char *)(lVar4 + -3 + uVar8);
      do {
        *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
    }
    uStack_50 = (code *)0x1237b7;
    out = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)__result.container,uVar9 - uVar3,&specs->fill);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}